

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BitmapDevice.cpp
# Opt level: O2

void __thiscall
TRM::BitmapDevice::Line(BitmapDevice *this,int32_t x0,int32_t y0,int32_t x1,int32_t y1,Color *color)

{
  undefined4 uVar1;
  Bitmap *this_00;
  int y;
  uint32_t x;
  uint uVar2;
  line_bresenham_interpolator li;
  Color local_64;
  line_bresenham_interpolator local_60;
  
  line_bresenham_interpolator::line_bresenham_interpolator
            (&local_60,x0 << 8,y0 << 8,x1 << 8,y1 << 8);
  if (local_60.m_len == 0) {
    Bitmap::SetPixel((this->mBitmap).super___shared_ptr<TRM::Bitmap,_(__gnu_cxx::_Lock_policy)2>.
                     _M_ptr,x0,y0,color);
  }
  else {
    uVar2 = local_60.m_len;
    if (local_60.m_ver == false) {
      do {
        Bitmap::SetPixel((this->mBitmap).super___shared_ptr<TRM::Bitmap,_(__gnu_cxx::_Lock_policy)2>
                         ._M_ptr,local_60.m_x1_lr,local_60.m_interpolator.m_y >> 8,color);
        line_bresenham_interpolator::h_step(&local_60);
        uVar2 = uVar2 - 1;
      } while (uVar2 != 0);
    }
    else {
      do {
        y = local_60.m_y1_lr;
        x = local_60.m_interpolator.m_y >> 8;
        uVar1 = *(undefined4 *)(color->fRGBA)._M_elems;
        this_00 = (this->mBitmap).super___shared_ptr<TRM::Bitmap,_(__gnu_cxx::_Lock_policy)2>._M_ptr
        ;
        Color::Color(&local_64,(uint8_t)uVar1,(uint8_t)((uint)uVar1 >> 8),
                     (uint8_t)((uint)uVar1 >> 0x10),0xff);
        Bitmap::SetPixel(this_00,x,y,&local_64);
        line_bresenham_interpolator::v_step(&local_60);
        uVar2 = uVar2 - 1;
      } while (uVar2 != 0);
    }
  }
  return;
}

Assistant:

void BitmapDevice::Line(int32_t x0, int32_t y0, int32_t x1, int32_t y1,
                        Color const& color) {
  int32_t s_x0 = x0 * line_bresenham_interpolator::subpixel_scale;
  int32_t s_y0 = y0 * line_bresenham_interpolator::subpixel_scale;
  int32_t s_x1 = x1 * line_bresenham_interpolator::subpixel_scale;
  int32_t s_y1 = y1 * line_bresenham_interpolator::subpixel_scale;

  line_bresenham_interpolator li{s_x0, s_y0, s_x1, s_y1};

  uint32_t len = li.len();

  if (len == 0) {
    mBitmap->SetPixel(x0, y0, color);
    return;
  }

  if (li.is_ver()) {
    do {
      int32_t s_x = li.x2();
      int32_t s_y = li.y1();

      int32_t i_x = li.x2_hr() % li.subpixel_mask;
      int32_t i_y = li.y2_hr() % li.subpixel_mask;

      double alpha = 255;

      auto rgba = color.rgba();
      mBitmap->SetPixel(s_x, s_y, Color(rgba[0], rgba[1], rgba[2], (uint8_t) alpha));

      li.v_step();
    } while (--len);
  } else {
    do {
      int32_t s_x = li.x1();
      int32_t s_y = li.y2();

      mBitmap->SetPixel(s_x, s_y, color);

      li.h_step();
    } while (--len);
  }
}